

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

string * __thiscall
chrono::
ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
GetClassRegisteredName
          (ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  int iVar1;
  ChException *anon_var_0;
  allocator local_19;
  ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_18 = this;
  if (ChValueSpecific<std::__cxx11::string>::GetClassRegisteredName()::nostring_abi_cxx11_ == '\0')
  {
    iVar1 = __cxa_guard_acquire(&ChValueSpecific<std::__cxx11::string>::GetClassRegisteredName()::
                                 nostring_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 &ChValueSpecific<std::__cxx11::string>::GetClassRegisteredName()::
                  nostring_abi_cxx11_,"",&local_19);
      std::allocator<char>::~allocator((allocator<char> *)&local_19);
      __cxa_atexit(std::__cxx11::string::~string,
                   &ChValueSpecific<std::__cxx11::string>::GetClassRegisteredName()::
                    nostring_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&ChValueSpecific<std::__cxx11::string>::GetClassRegisteredName()::
                           nostring_abi_cxx11_);
    }
  }
  if (this->_ptr_to_val == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    this_local = (ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&ChValueSpecific<std::__cxx11::string>::GetClassRegisteredName()::
                     nostring_abi_cxx11_;
  }
  else {
    this_local = (ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)ChClassFactory::GetClassTagName_abi_cxx11_
                              ((type_info *)&std::__cxx11::string::typeinfo);
  }
  return (string *)this_local;
}

Assistant:

virtual std::string& GetClassRegisteredName() {
          static std::string nostring("");
          if (!_ptr_to_val) {
              return nostring;
          }
          try {
              return ChClassFactory::GetClassTagName(typeid(*_ptr_to_val));
          }catch (const ChException &) {
              return nostring;
          }
        }